

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsHtmlElement.cpp
# Opt level: O1

void __thiscall KDReports::HtmlElement::HtmlElement(HtmlElement *this,HtmlElement *other)

{
  HtmlElementPrivate *pHVar1;
  int *piVar2;
  HtmlElementPrivate *pHVar3;
  
  Element::Element(&this->super_Element,&other->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__HtmlElement_00174208;
  pHVar3 = (HtmlElementPrivate *)operator_new(0x30);
  pHVar1 = (other->d)._M_t.
           super___uniq_ptr_impl<KDReports::HtmlElementPrivate,_std::default_delete<KDReports::HtmlElementPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::HtmlElementPrivate_*,_std::default_delete<KDReports::HtmlElementPrivate>_>
           .super__Head_base<0UL,_KDReports::HtmlElementPrivate_*,_false>._M_head_impl;
  piVar2 = *(int **)&(pHVar1->m_html).d;
  *(int **)&(pHVar3->m_html).d = piVar2;
  *(char16_t **)((long)&(pHVar3->m_html).d + 8) = *(char16_t **)((long)&(pHVar1->m_html).d + 8);
  *(qsizetype *)((long)&(pHVar3->m_html).d + 0x10) =
       *(qsizetype *)((long)&(pHVar1->m_html).d + 0x10);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  piVar2 = (int *)(pHVar1->m_id).d.d;
  (pHVar3->m_id).d.d = (Data *)piVar2;
  *(char16_t **)((long)&(pHVar3->m_id).d + 8) = *(char16_t **)((long)&(pHVar1->m_id).d + 8);
  *(qsizetype *)((long)&(pHVar3->m_id).d + 0x10) = *(qsizetype *)((long)&(pHVar1->m_id).d + 0x10);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  (this->d)._M_t.
  super___uniq_ptr_impl<KDReports::HtmlElementPrivate,_std::default_delete<KDReports::HtmlElementPrivate>_>
  ._M_t.
  super__Tuple_impl<0UL,_KDReports::HtmlElementPrivate_*,_std::default_delete<KDReports::HtmlElementPrivate>_>
  .super__Head_base<0UL,_KDReports::HtmlElementPrivate_*,_false>._M_head_impl = pHVar3;
  return;
}

Assistant:

KDReports::HtmlElement::HtmlElement(const HtmlElement &other)
    : Element(other)
    , d(new HtmlElementPrivate(*other.d))
{
}